

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObject.cpp
# Opt level: O3

void __thiscall Js::DynamicObject::SetArrayFlags(DynamicObject *this,DynamicObjectFlags flags)

{
  code *pcVar1;
  bool bVar2;
  Type TVar3;
  undefined4 *puVar4;
  
  bVar2 = IsAnyArray(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                ,0x28e,"(IsAnyArray(this))","IsAnyArray(this)");
    if (!bVar2) goto LAB_00dadf82;
    *puVar4 = 0;
  }
  TVar3 = (this->field_1).field_1.arrayFlags;
  if ((TVar3 & ObjectArrayFlagsTag) == None) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                ,0x28f,"(UsesObjectArrayOrFlagsAsFlags())",
                                "UsesObjectArrayOrFlagsAsFlags()");
    if (!bVar2) goto LAB_00dadf82;
    *puVar4 = 0;
    TVar3 = (this->field_1).field_1.arrayFlags;
  }
  if ((TVar3 & ~AllArrayFlags) != ObjectArrayFlagsTag) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                ,0x291,
                                "((arrayFlags & ~DynamicObjectFlags::AllArrayFlags) == DynamicObjectFlags::ObjectArrayFlagsTag)"
                                ,
                                "(arrayFlags & ~DynamicObjectFlags::AllArrayFlags) == DynamicObjectFlags::ObjectArrayFlagsTag"
                               );
    if (!bVar2) goto LAB_00dadf82;
    *puVar4 = 0;
  }
  if ((flags & ~AllArrayFlags) != None) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                ,0x292,
                                "((flags & ~DynamicObjectFlags::AllArrayFlags) == DynamicObjectFlags::None)"
                                ,
                                "(flags & ~DynamicObjectFlags::AllArrayFlags) == DynamicObjectFlags::None"
                               );
    if (!bVar2) {
LAB_00dadf82:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  (this->field_1).field_1.arrayFlags = flags | ObjectArrayFlagsTag;
  return;
}

Assistant:

void DynamicObject::SetArrayFlags(const DynamicObjectFlags flags)
    {
        Assert(IsAnyArray(this));
        Assert(UsesObjectArrayOrFlagsAsFlags()); // an array object never has another internal array
        // Make sure we don't attempt to set any flags outside of the range of array flags.
        Assert((arrayFlags & ~DynamicObjectFlags::AllArrayFlags) == DynamicObjectFlags::ObjectArrayFlagsTag);
        Assert((flags & ~DynamicObjectFlags::AllArrayFlags) == DynamicObjectFlags::None);
        arrayFlags = flags | DynamicObjectFlags::ObjectArrayFlagsTag;
    }